

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  float *pfVar2;
  BVH *bvh;
  size_t sVar3;
  Geometry *pGVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  vfloat_impl<4> vVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  vfloat_impl<4> vVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 uVar25;
  undefined8 uVar26;
  undefined4 in_EAX;
  int iVar27;
  uint uVar28;
  AABBNodeMB4D *node1;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  undefined8 uVar33;
  undefined4 uVar34;
  int iVar35;
  Intersectors *pIVar36;
  ulong uVar37;
  ulong uVar38;
  uint uVar39;
  float *vertices1;
  ulong uVar40;
  ulong uVar41;
  vuint<4> *v;
  long lVar42;
  long lVar43;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar44;
  size_t sVar45;
  NodeRef root;
  QuadMesh *mesh;
  NodeRef *pNVar46;
  bool bVar47;
  float fVar48;
  float fVar49;
  float fVar65;
  float fVar67;
  vint4 ai;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar69;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar66;
  float fVar68;
  float fVar70;
  float fVar71;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar64;
  float fVar72;
  float fVar82;
  float fVar83;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar84;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar78;
  undefined1 auVar79 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar80;
  undefined1 auVar81 [16];
  float fVar85;
  float fVar86;
  float fVar94;
  float fVar96;
  float fVar98;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar87;
  undefined1 auVar88 [16];
  float fVar95;
  float fVar97;
  float fVar99;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar100;
  float fVar101;
  float fVar104;
  float fVar106;
  vint4 ai_1;
  undefined1 auVar102 [16];
  float fVar105;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar103 [16];
  float fVar111;
  float fVar112;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  vint4 ai_3;
  undefined1 auVar113 [16];
  float fVar119;
  undefined1 auVar114 [16];
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar126;
  float fVar129;
  vint4 bi;
  undefined1 auVar123 [16];
  float fVar127;
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  vint4 bi_3;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar153;
  float fVar154;
  vint4 bi_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar155;
  undefined1 auVar150 [16];
  vfloat_impl<4> vVar151;
  undefined1 auVar152 [16];
  uint uVar156;
  uint uVar157;
  float fVar158;
  float fVar159;
  uint uVar160;
  uint uVar161;
  float fVar162;
  float fVar163;
  uint uVar164;
  uint uVar165;
  float fVar166;
  float fVar167;
  vint4 ai_2;
  uint uVar168;
  uint uVar169;
  float fVar170;
  float fVar171;
  uint uVar172;
  uint uVar173;
  uint uVar174;
  uint uVar175;
  uint uVar176;
  uint uVar177;
  vint4 bi_2;
  uint uVar178;
  uint uVar179;
  float fVar180;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar181 [16];
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar193 [16];
  vfloat_impl<4> vVar194;
  float fVar198;
  float fVar202;
  float fVar203;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar199;
  float fVar204;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar205;
  float fVar209;
  float fVar210;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar211;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar208;
  TravRayK<4,_false> *tray_00;
  float local_19f8;
  float fStack_19f4;
  float fStack_19f0;
  float fStack_19ec;
  vuint<4> *v_1;
  float local_19d8;
  float fStack_19d4;
  float fStack_19d0;
  float fStack_19cc;
  Precalculations pre;
  undefined1 local_19b8 [16];
  vint<4> itime;
  Vec3<embree::vfloat_impl<4>_> p1;
  float local_1968;
  float fStack_1964;
  float fStack_1960;
  float fStack_195c;
  vbool<4> terminated;
  Vec3<embree::vfloat_impl<4>_> p0;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  auVar81 = mm_lookupmask_ps._240_16_;
  uVar26 = mm_lookupmask_ps._8_8_;
  uVar25 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar201._8_4_ = 0xffffffff;
    auVar201._0_8_ = 0xffffffffffffffff;
    auVar201._12_4_ = 0xffffffff;
    auVar102 = *(undefined1 (*) [16])(ray + 0x80);
    auVar113._0_12_ = ZEXT812(0);
    auVar113._12_4_ = 0;
    uVar172 = -(uint)(0.0 <= auVar102._0_4_ && (valid_i->field_0).i[0] == -1);
    uVar174 = -(uint)(0.0 <= auVar102._4_4_ && (valid_i->field_0).i[1] == -1);
    uVar176 = -(uint)(0.0 <= auVar102._8_4_ && (valid_i->field_0).i[2] == -1);
    uVar178 = -(uint)(0.0 <= auVar102._12_4_ && (valid_i->field_0).i[3] == -1);
    auVar51._4_4_ = uVar174;
    auVar51._0_4_ = uVar172;
    auVar51._8_4_ = uVar176;
    auVar51._12_4_ = uVar178;
    iVar27 = movmskps(in_EAX,auVar51);
    if (iVar27 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar135 = (float)DAT_01ff1d40;
      fVar138 = DAT_01ff1d40._4_4_;
      fVar141 = DAT_01ff1d40._8_4_;
      fVar144 = DAT_01ff1d40._12_4_;
      auVar73._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < fVar138);
      auVar73._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < fVar135);
      auVar73._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < fVar141);
      auVar73._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < fVar144);
      auVar148 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01ff1d40,auVar73
                         );
      auVar123._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar138);
      auVar123._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar135);
      auVar123._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar141);
      auVar123._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar144);
      auVar73 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01ff1d40,auVar123
                        );
      auVar50._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < fVar138);
      auVar50._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < fVar135);
      auVar50._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < fVar141);
      auVar50._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < fVar144);
      auVar123 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01ff1d40,auVar50
                         );
      auVar51 = rcpps(auVar50,auVar148);
      fVar135 = auVar51._0_4_;
      auVar149._0_4_ = auVar148._0_4_ * fVar135;
      fVar138 = auVar51._4_4_;
      auVar149._4_4_ = auVar148._4_4_ * fVar138;
      fVar141 = auVar51._8_4_;
      auVar149._8_4_ = auVar148._8_4_ * fVar141;
      fVar144 = auVar51._12_4_;
      auVar149._12_4_ = auVar148._12_4_ * fVar144;
      tray.rdir.field_0._0_4_ = (1.0 - auVar149._0_4_) * fVar135 + fVar135;
      tray.rdir.field_0._4_4_ = (1.0 - auVar149._4_4_) * fVar138 + fVar138;
      tray.rdir.field_0._8_4_ = (1.0 - auVar149._8_4_) * fVar141 + fVar141;
      tray.rdir.field_0._12_4_ = (1.0 - auVar149._12_4_) * fVar144 + fVar144;
      auVar51 = rcpps(auVar149,auVar73);
      fVar135 = auVar51._0_4_;
      fVar138 = auVar51._4_4_;
      fVar141 = auVar51._8_4_;
      fVar144 = auVar51._12_4_;
      tray.rdir.field_0._16_4_ = (1.0 - auVar73._0_4_ * fVar135) * fVar135 + fVar135;
      tray.rdir.field_0._20_4_ = (1.0 - auVar73._4_4_ * fVar138) * fVar138 + fVar138;
      tray.rdir.field_0._24_4_ = (1.0 - auVar73._8_4_ * fVar141) * fVar141 + fVar141;
      tray.rdir.field_0._28_4_ = (1.0 - auVar73._12_4_ * fVar144) * fVar144 + fVar144;
      auVar51 = rcpps(auVar51,auVar123);
      fVar135 = auVar51._0_4_;
      fVar138 = auVar51._4_4_;
      fVar141 = auVar51._8_4_;
      fVar144 = auVar51._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar123._0_4_ * fVar135) * fVar135 + fVar135;
      tray.rdir.field_0._36_4_ = (1.0 - auVar123._4_4_ * fVar138) * fVar138 + fVar138;
      tray.rdir.field_0._40_4_ = (1.0 - auVar123._8_4_ * fVar141) * fVar141 + fVar141;
      tray.rdir.field_0._44_4_ = (1.0 - auVar123._12_4_ * fVar144) * fVar144 + fVar144;
      auVar148._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar148._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar148._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar148._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fed0,_DAT_01ffd210,auVar148);
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar52._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar52._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar52._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar52._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fef0,_DAT_0201fee0,auVar52);
      auVar51 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar113);
      auVar53._4_4_ = uVar174;
      auVar53._0_4_ = uVar172;
      auVar53._8_4_ = uVar176;
      auVar53._12_4_ = uVar178;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01feb9f0,auVar51,auVar53);
      auVar102 = maxps(auVar102,auVar113);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01feba00,auVar102,auVar53);
      auVar102._4_4_ = uVar174;
      auVar102._0_4_ = uVar172;
      auVar102._8_4_ = uVar176;
      auVar102._12_4_ = uVar178;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar201 ^ auVar102);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar39 = 3;
      }
      else {
        uVar39 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar46 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar44 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01feb9f0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      iVar27 = 0x224ff80;
      aVar208 = _DAT_01feb9f0;
      do {
        paVar44 = paVar44 + -1;
        root.ptr = pNVar46[-1].ptr;
        pNVar46 = pNVar46 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_0024cc99:
          iVar27 = 3;
        }
        else {
          aVar87.v = *(__m128 *)paVar44->v;
          auVar54._4_4_ = -(uint)(aVar87.v[1] < tray.tfar.field_0.v[1]);
          auVar54._0_4_ = -(uint)(aVar87.v[0] < tray.tfar.field_0.v[0]);
          auVar54._8_4_ = -(uint)(aVar87.v[2] < tray.tfar.field_0.v[2]);
          auVar54._12_4_ = -(uint)(aVar87.v[3] < tray.tfar.field_0.v[3]);
          uVar28 = movmskps(iVar27,auVar54);
          if (uVar28 == 0) {
LAB_0024ccaa:
            iVar27 = 2;
          }
          else {
            uVar29 = (ulong)(uVar28 & 0xff);
            uVar28 = POPCOUNT(uVar28 & 0xff);
            iVar27 = 0;
            if (uVar28 <= uVar39) {
              do {
                sVar45 = 0;
                if (uVar29 != 0) {
                  for (; (uVar29 >> sVar45 & 1) == 0; sVar45 = sVar45 + 1) {
                  }
                }
                tray_00 = &tray;
                bVar47 = occluded1(This,bvh,root,sVar45,&pre,ray,tray_00,context);
                if (bVar47) {
                  terminated.field_0.i[sVar45] = -1;
                }
                uVar29 = uVar29 & uVar29 - 1;
              } while (uVar29 != 0);
              iVar35 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
              iVar27 = 3;
              valid_i = (vint<4> *)This;
              aVar208 = _DAT_01feb9f0;
              if (iVar35 != 0xf) {
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                              (undefined1  [16])terminated.field_0);
                iVar27 = 2;
              }
            }
            if (uVar39 < uVar28) {
              do {
                fVar135 = aVar87.v[0];
                fVar138 = aVar87.v[1];
                fVar141 = aVar87.v[2];
                fVar144 = aVar87.v[3];
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_0024cc99;
                  auVar57._4_4_ = -(uint)(fVar138 < tray.tfar.field_0.v[1]);
                  auVar57._0_4_ = -(uint)(fVar135 < tray.tfar.field_0.v[0]);
                  auVar57._8_4_ = -(uint)(fVar141 < tray.tfar.field_0.v[2]);
                  auVar57._12_4_ = -(uint)(fVar144 < tray.tfar.field_0.v[3]);
                  iVar27 = movmskps(iVar27,auVar57);
                  if (iVar27 != 0) {
                    uVar30 = (ulong)((uint)root.ptr & 0xf) - 8;
                    uVar29 = uVar30;
                    aVar64 = terminated.field_0;
                    if (uVar30 != 0) {
                      auVar58._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                      auVar58._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
                      auVar58._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
                      uVar29 = 0;
                      do {
                        lVar42 = uVar29 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                        uVar34 = movmskps((int)uVar29,auVar58);
                        uVar31 = CONCAT44((int)(uVar29 >> 0x20),uVar34);
                        uVar37 = 0;
                        local_19b8 = auVar58;
                        while( true ) {
                          uVar28 = *(uint *)(lVar42 + 0x50 + uVar37 * 4);
                          uVar32 = (ulong)uVar28;
                          if (uVar28 == 0xffffffff) break;
                          pGVar4 = (context->scene->geometries).items
                                   [*(uint *)(lVar42 + 0x40 + uVar37 * 4)].ptr;
                          fVar135 = pGVar4->fnumTimeSegments;
                          fVar138 = (pGVar4->time_range).lower;
                          auVar88._0_4_ = (pGVar4->time_range).upper - fVar138;
                          auVar74._4_4_ = fVar138;
                          auVar74._0_4_ = fVar138;
                          auVar74._8_4_ = fVar138;
                          auVar74._12_4_ = fVar138;
                          auVar206._0_4_ = *(float *)(ray + 0x70) - fVar138;
                          auVar206._4_4_ = *(float *)(ray + 0x74) - fVar138;
                          auVar206._8_4_ = *(float *)(ray + 0x78) - fVar138;
                          auVar206._12_4_ = *(float *)(ray + 0x7c) - fVar138;
                          auVar88._4_4_ = auVar88._0_4_;
                          auVar88._8_4_ = auVar88._0_4_;
                          auVar88._12_4_ = auVar88._0_4_;
                          auVar102 = divps(auVar206,auVar88);
                          auVar207._0_4_ = auVar102._0_4_ * fVar135;
                          auVar207._4_4_ = auVar102._4_4_ * fVar135;
                          auVar207._8_4_ = auVar102._8_4_ * fVar135;
                          auVar207._12_4_ = auVar102._12_4_ * fVar135;
                          auVar102 = roundps(auVar74,auVar207,1);
                          auVar114._0_4_ = fVar135 + -1.0;
                          auVar114._4_4_ = auVar114._0_4_;
                          auVar114._8_4_ = auVar114._0_4_;
                          auVar114._12_4_ = auVar114._0_4_;
                          auVar102 = minps(auVar102,auVar114);
                          auVar102 = maxps(auVar102,_DAT_01feba10);
                          fVar135 = auVar207._0_4_ - auVar102._0_4_;
                          fVar138 = auVar207._4_4_ - auVar102._4_4_;
                          fVar141 = auVar207._8_4_ - auVar102._8_4_;
                          fVar144 = auVar207._12_4_ - auVar102._12_4_;
                          itime.field_0.i[0] = (int)auVar102._0_4_;
                          itime.field_0.i[1] = (int)auVar102._4_4_;
                          itime.field_0.i[2] = (int)auVar102._8_4_;
                          itime.field_0.i[3] = (int)auVar102._12_4_;
                          uVar32 = 0;
                          if (uVar31 != 0) {
                            for (; (uVar31 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                            }
                          }
                          iVar27 = itime.field_0.i[uVar32];
                          auVar75._0_4_ = -(uint)(iVar27 == itime.field_0.i[0]);
                          auVar75._4_4_ = -(uint)(iVar27 == itime.field_0.i[1]);
                          auVar75._8_4_ = -(uint)(iVar27 == itime.field_0.i[2]);
                          auVar75._12_4_ = -(uint)(iVar27 == itime.field_0.i[3]);
                          uVar156 = movmskps((int)valid_i,~auVar75 & auVar58);
                          valid_i = (vint<4> *)(ulong)uVar156;
                          if (uVar156 == 0) {
                            uVar32 = *(ulong *)(*(long *)&pGVar4[2].numPrimitives +
                                               (long)iVar27 * 0x38);
                            lVar5 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 +
                                             (long)iVar27 * 0x38);
                            uVar40 = (ulong)*(uint *)(lVar42 + uVar37 * 4);
                            uVar41 = (ulong)*(uint *)(lVar42 + 0x10 + uVar37 * 4);
                            pfVar2 = (float *)(uVar32 + uVar40 * 4);
                            fVar108 = *pfVar2;
                            fVar121 = pfVar2[1];
                            fVar187 = pfVar2[2];
                            pfVar2 = (float *)(lVar5 + uVar40 * 4);
                            fVar136 = *pfVar2;
                            fVar139 = pfVar2[1];
                            fVar48 = pfVar2[2];
                            fVar147 = 1.0 - fVar135;
                            fVar153 = 1.0 - fVar138;
                            fVar154 = 1.0 - fVar141;
                            fVar109 = 1.0 - fVar144;
                            fVar69 = fVar108 * fVar147 + fVar136 * fVar135;
                            fVar100 = fVar108 * fVar153 + fVar136 * fVar138;
                            fVar132 = fVar108 * fVar154 + fVar136 * fVar141;
                            fVar108 = fVar108 * fVar109 + fVar136 * fVar144;
                            fVar136 = fVar121 * fVar147 + fVar139 * fVar135;
                            fVar111 = fVar121 * fVar153 + fVar139 * fVar138;
                            fVar119 = fVar121 * fVar154 + fVar139 * fVar141;
                            fVar121 = fVar121 * fVar109 + fVar139 * fVar144;
                            fVar139 = fVar187 * fVar147 + fVar48 * fVar135;
                            fVar142 = fVar187 * fVar153 + fVar48 * fVar138;
                            fVar145 = fVar187 * fVar154 + fVar48 * fVar141;
                            fVar187 = fVar187 * fVar109 + fVar48 * fVar144;
                            pfVar2 = (float *)(uVar32 + uVar41 * 4);
                            fVar48 = *pfVar2;
                            fVar65 = pfVar2[1];
                            fVar67 = pfVar2[2];
                            pfVar2 = (float *)(lVar5 + uVar41 * 4);
                            fVar85 = *pfVar2;
                            fVar94 = pfVar2[1];
                            fVar96 = pfVar2[2];
                            fVar155 = fVar48 * fVar147 + fVar85 * fVar135;
                            fVar182 = fVar48 * fVar153 + fVar85 * fVar138;
                            fVar185 = fVar48 * fVar154 + fVar85 * fVar141;
                            fVar70 = fVar48 * fVar109 + fVar85 * fVar144;
                            fVar72 = fVar65 * fVar147 + fVar94 * fVar135;
                            fVar82 = fVar65 * fVar153 + fVar94 * fVar138;
                            fVar83 = fVar65 * fVar154 + fVar94 * fVar141;
                            fVar84 = fVar65 * fVar109 + fVar94 * fVar144;
                            fVar158 = fVar67 * fVar147 + fVar96 * fVar135;
                            fVar162 = fVar67 * fVar153 + fVar96 * fVar138;
                            fVar166 = fVar67 * fVar154 + fVar96 * fVar141;
                            fVar170 = fVar67 * fVar109 + fVar96 * fVar144;
                            uVar41 = (ulong)*(uint *)(lVar42 + 0x20 + uVar37 * 4);
                            pfVar2 = (float *)(uVar32 + uVar41 * 4);
                            fVar48 = *pfVar2;
                            fVar65 = pfVar2[1];
                            fVar67 = pfVar2[2];
                            pfVar2 = (float *)(lVar5 + uVar41 * 4);
                            fVar85 = *pfVar2;
                            fVar94 = pfVar2[1];
                            fVar96 = pfVar2[2];
                            fStack_19d4 = fVar48 * fVar153 + fVar85 * fVar138;
                            local_19d8 = fVar48 * fVar147 + fVar85 * fVar135;
                            fStack_19d0 = fVar48 * fVar154 + fVar85 * fVar141;
                            fStack_19cc = fVar48 * fVar109 + fVar85 * fVar144;
                            local_1968 = fVar65 * fVar147 + fVar94 * fVar135;
                            fStack_1964 = fVar65 * fVar153 + fVar94 * fVar138;
                            fStack_1960 = fVar65 * fVar154 + fVar94 * fVar141;
                            fStack_195c = fVar65 * fVar109 + fVar94 * fVar144;
                            fStack_19f4 = fVar67 * fVar153 + fVar96 * fVar138;
                            local_19f8 = fVar67 * fVar147 + fVar96 * fVar135;
                            fStack_19f0 = fVar67 * fVar154 + fVar96 * fVar141;
                            fStack_19ec = fVar67 * fVar109 + fVar96 * fVar144;
                            valid_i = (vint<4> *)(ulong)*(uint *)(lVar42 + 0x30 + uVar37 * 4);
                            pfVar2 = (float *)(lVar5 + (long)valid_i * 4);
                            fVar48 = *pfVar2;
                            fVar65 = pfVar2[1];
                            fVar67 = pfVar2[2];
                            pfVar2 = (float *)(uVar32 + (long)valid_i * 4);
                            fVar85 = *pfVar2;
                            fVar126 = pfVar2[1];
                            fVar129 = pfVar2[2];
                            fVar94 = fVar85 * fVar147 + fVar48 * fVar135;
                            fVar96 = fVar85 * fVar153 + fVar48 * fVar138;
                            fVar98 = fVar85 * fVar154 + fVar48 * fVar141;
                            fVar104 = fVar85 * fVar109 + fVar48 * fVar144;
                            fVar106 = fVar126 * fVar147 + fVar65 * fVar135;
                            fVar115 = fVar126 * fVar153 + fVar65 * fVar138;
                            fVar117 = fVar126 * fVar154 + fVar65 * fVar141;
                            fVar126 = fVar126 * fVar109 + fVar65 * fVar144;
                            fVar135 = fVar129 * fVar147 + fVar67 * fVar135;
                            fVar138 = fVar129 * fVar153 + fVar67 * fVar138;
                            fVar141 = fVar129 * fVar154 + fVar67 * fVar141;
                            fVar144 = fVar129 * fVar109 + fVar67 * fVar144;
                          }
                          else {
                            if (uVar31 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              uVar38 = (ulong)*(uint *)(lVar42 + uVar37 * 4);
                              uVar40 = uVar31;
                              uVar41 = uVar32;
                              do {
                                lVar43 = (long)itime.field_0.i[uVar41] * 0x38;
                                valid_i = *(vint<4> **)(lVar5 + lVar43);
                                auVar102 = *(undefined1 (*) [16])
                                            ((long)&((Intersectors *)valid_i)->ptr + uVar38 * 4);
                                auVar51 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + 0x38 + lVar43) + uVar38 * 4);
                                *(int *)((long)&p0.field_0 + uVar41 * 4) = auVar102._0_4_;
                                uVar33 = extractps(auVar102,1);
                                *(undefined8 *)((long)&p0.field_0 + uVar41 * 4 + 0x10) = uVar33;
                                uVar33 = extractps(auVar102,2);
                                *(undefined8 *)((long)&p0.field_0 + uVar41 * 4 + 0x20) = uVar33;
                                *(int *)((long)&p1.field_0 + uVar41 * 4) = auVar51._0_4_;
                                uVar33 = extractps(auVar51,1);
                                *(undefined8 *)((long)&p1.field_0 + uVar41 * 4 + 0x10) = uVar33;
                                uVar33 = extractps(auVar51,2);
                                *(undefined8 *)((long)&p1.field_0 + uVar41 * 4 + 0x20) = uVar33;
                                uVar40 = uVar40 ^ 1L << (uVar41 & 0x3f);
                                uVar41 = 0;
                                if (uVar40 != 0) {
                                  for (; (uVar40 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                                  }
                                }
                              } while (uVar40 != 0);
                            }
                            fVar48 = 1.0 - fVar135;
                            fVar65 = 1.0 - fVar138;
                            fVar67 = 1.0 - fVar141;
                            fVar85 = 1.0 - fVar144;
                            fVar69 = (float)p0.field_0._0_4_ * fVar48;
                            fVar100 = (float)p0.field_0._4_4_ * fVar65;
                            fVar132 = (float)p0.field_0._8_4_ * fVar67;
                            fVar108 = (float)p0.field_0._12_4_ * fVar85;
                            fVar136 = (float)p0.field_0._16_4_ * fVar48;
                            fVar111 = (float)p0.field_0._20_4_ * fVar65;
                            fVar119 = (float)p0.field_0._24_4_ * fVar67;
                            fVar121 = (float)p0.field_0._28_4_ * fVar85;
                            fVar139 = (float)p0.field_0._32_4_ * fVar48;
                            fVar142 = (float)p0.field_0._36_4_ * fVar65;
                            fVar145 = (float)p0.field_0._40_4_ * fVar67;
                            fVar187 = (float)p0.field_0._44_4_ * fVar85;
                            fVar94 = (float)p1.field_0._0_4_ * fVar135;
                            fVar96 = (float)p1.field_0._4_4_ * fVar138;
                            fVar98 = (float)p1.field_0._8_4_ * fVar141;
                            fVar104 = (float)p1.field_0._12_4_ * fVar144;
                            fVar106 = (float)p1.field_0._16_4_ * fVar135;
                            fVar115 = (float)p1.field_0._20_4_ * fVar138;
                            fVar117 = (float)p1.field_0._24_4_ * fVar141;
                            fVar126 = (float)p1.field_0._28_4_ * fVar144;
                            fVar129 = (float)p1.field_0._32_4_ * fVar135;
                            fVar147 = (float)p1.field_0._36_4_ * fVar138;
                            fVar153 = (float)p1.field_0._40_4_ * fVar141;
                            fVar154 = (float)p1.field_0._44_4_ * fVar144;
                            if (uVar31 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              uVar38 = (ulong)*(uint *)(lVar42 + 0x10 + uVar37 * 4);
                              uVar40 = uVar31;
                              uVar41 = uVar32;
                              do {
                                lVar43 = (long)itime.field_0.i[uVar41] * 0x38;
                                valid_i = *(vint<4> **)(lVar5 + lVar43);
                                auVar102 = *(undefined1 (*) [16])
                                            ((long)&((Intersectors *)valid_i)->ptr + uVar38 * 4);
                                auVar51 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + 0x38 + lVar43) + uVar38 * 4);
                                *(int *)((long)&p0.field_0 + uVar41 * 4) = auVar102._0_4_;
                                uVar33 = extractps(auVar102,1);
                                *(undefined8 *)((long)&p0.field_0 + uVar41 * 4 + 0x10) = uVar33;
                                uVar33 = extractps(auVar102,2);
                                *(undefined8 *)((long)&p0.field_0 + uVar41 * 4 + 0x20) = uVar33;
                                *(int *)((long)&p1.field_0 + uVar41 * 4) = auVar51._0_4_;
                                uVar33 = extractps(auVar51,1);
                                *(undefined8 *)((long)&p1.field_0 + uVar41 * 4 + 0x10) = uVar33;
                                uVar33 = extractps(auVar51,2);
                                *(undefined8 *)((long)&p1.field_0 + uVar41 * 4 + 0x20) = uVar33;
                                uVar40 = uVar40 ^ 1L << (uVar41 & 0x3f);
                                uVar41 = 0;
                                if (uVar40 != 0) {
                                  for (; (uVar40 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                                  }
                                }
                              } while (uVar40 != 0);
                            }
                            fVar155 = (float)p0.field_0._0_4_ * fVar48;
                            fVar182 = (float)p0.field_0._4_4_ * fVar65;
                            fVar185 = (float)p0.field_0._8_4_ * fVar67;
                            fVar70 = (float)p0.field_0._12_4_ * fVar85;
                            fVar72 = (float)p0.field_0._16_4_ * fVar48;
                            fVar82 = (float)p0.field_0._20_4_ * fVar65;
                            fVar83 = (float)p0.field_0._24_4_ * fVar67;
                            fVar84 = (float)p0.field_0._28_4_ * fVar85;
                            fVar158 = (float)p0.field_0._32_4_ * fVar48;
                            fVar162 = (float)p0.field_0._36_4_ * fVar65;
                            fVar166 = (float)p0.field_0._40_4_ * fVar67;
                            fVar170 = (float)p0.field_0._44_4_ * fVar85;
                            fVar109 = (float)p1.field_0._0_4_ * fVar135;
                            fVar128 = (float)p1.field_0._4_4_ * fVar138;
                            fVar131 = (float)p1.field_0._8_4_ * fVar141;
                            fVar134 = (float)p1.field_0._12_4_ * fVar144;
                            fVar49 = (float)p1.field_0._16_4_ * fVar135;
                            fVar66 = (float)p1.field_0._20_4_ * fVar138;
                            fVar68 = (float)p1.field_0._24_4_ * fVar141;
                            fVar71 = (float)p1.field_0._28_4_ * fVar144;
                            fVar86 = (float)p1.field_0._32_4_ * fVar135;
                            fVar95 = (float)p1.field_0._36_4_ * fVar138;
                            fVar97 = (float)p1.field_0._40_4_ * fVar141;
                            fVar99 = (float)p1.field_0._44_4_ * fVar144;
                            if (uVar31 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              uVar38 = (ulong)*(uint *)(lVar42 + 0x20 + uVar37 * 4);
                              uVar40 = uVar31;
                              uVar41 = uVar32;
                              do {
                                lVar43 = (long)itime.field_0.i[uVar41] * 0x38;
                                valid_i = *(vint<4> **)(lVar5 + lVar43);
                                auVar102 = *(undefined1 (*) [16])
                                            ((long)&((Intersectors *)valid_i)->ptr + uVar38 * 4);
                                auVar51 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + 0x38 + lVar43) + uVar38 * 4);
                                *(int *)((long)&p0.field_0 + uVar41 * 4) = auVar102._0_4_;
                                uVar33 = extractps(auVar102,1);
                                *(undefined8 *)((long)&p0.field_0 + uVar41 * 4 + 0x10) = uVar33;
                                uVar33 = extractps(auVar102,2);
                                *(undefined8 *)((long)&p0.field_0 + uVar41 * 4 + 0x20) = uVar33;
                                *(int *)((long)&p1.field_0 + uVar41 * 4) = auVar51._0_4_;
                                uVar33 = extractps(auVar51,1);
                                *(undefined8 *)((long)&p1.field_0 + uVar41 * 4 + 0x10) = uVar33;
                                uVar33 = extractps(auVar51,2);
                                *(undefined8 *)((long)&p1.field_0 + uVar41 * 4 + 0x20) = uVar33;
                                uVar40 = uVar40 ^ 1L << (uVar41 & 0x3f);
                                uVar41 = 0;
                                if (uVar40 != 0) {
                                  for (; (uVar40 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                                  }
                                }
                              } while (uVar40 != 0);
                            }
                            fVar101 = (float)p0.field_0._0_4_ * fVar48;
                            fVar110 = (float)p0.field_0._4_4_ * fVar65;
                            fVar118 = (float)p0.field_0._8_4_ * fVar67;
                            fVar127 = (float)p0.field_0._12_4_ * fVar85;
                            local_1968 = (float)p0.field_0._16_4_ * fVar48;
                            fStack_1964 = (float)p0.field_0._20_4_ * fVar65;
                            fStack_1960 = (float)p0.field_0._24_4_ * fVar67;
                            fStack_195c = (float)p0.field_0._28_4_ * fVar85;
                            fVar105 = (float)p0.field_0._32_4_ * fVar48;
                            fVar112 = (float)p0.field_0._36_4_ * fVar65;
                            fVar120 = (float)p0.field_0._40_4_ * fVar67;
                            fVar130 = (float)p0.field_0._44_4_ * fVar85;
                            fVar107 = (float)p1.field_0._0_4_ * fVar135;
                            fVar116 = (float)p1.field_0._4_4_ * fVar138;
                            fVar122 = (float)p1.field_0._8_4_ * fVar141;
                            fVar133 = (float)p1.field_0._12_4_ * fVar144;
                            fVar137 = (float)p1.field_0._16_4_ * fVar135;
                            fVar140 = (float)p1.field_0._20_4_ * fVar138;
                            fVar143 = (float)p1.field_0._24_4_ * fVar141;
                            fVar146 = (float)p1.field_0._28_4_ * fVar144;
                            fVar159 = (float)p1.field_0._32_4_ * fVar135;
                            fVar163 = (float)p1.field_0._36_4_ * fVar138;
                            fVar167 = (float)p1.field_0._40_4_ * fVar141;
                            fVar171 = (float)p1.field_0._44_4_ * fVar144;
                            if (uVar31 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              valid_i = (vint<4> *)(lVar5 + 0x38);
                              uVar40 = (ulong)*(uint *)(lVar42 + 0x30 + uVar37 * 4);
                              uVar41 = uVar31;
                              do {
                                auVar102 = *(undefined1 (*) [16])
                                            (*(long *)(lVar5 + (long)itime.field_0.i[uVar32] * 0x38)
                                            + uVar40 * 4);
                                auVar51 = *(undefined1 (*) [16])
                                           ((long)&((&((Intersectors *)valid_i)->ptr)
                                                    [(long)itime.field_0.i[uVar32] * 7]->
                                                   super_RefCount)._vptr_RefCount + uVar40 * 4);
                                *(int *)((long)&p0.field_0 + uVar32 * 4) = auVar102._0_4_;
                                uVar33 = extractps(auVar102,1);
                                *(undefined8 *)((long)&p0.field_0 + uVar32 * 4 + 0x10) = uVar33;
                                uVar33 = extractps(auVar102,2);
                                *(undefined8 *)((long)&p0.field_0 + uVar32 * 4 + 0x20) = uVar33;
                                *(int *)((long)&p1.field_0 + uVar32 * 4) = auVar51._0_4_;
                                uVar33 = extractps(auVar51,1);
                                *(undefined8 *)((long)&p1.field_0 + uVar32 * 4 + 0x10) = uVar33;
                                uVar33 = extractps(auVar51,2);
                                *(undefined8 *)((long)&p1.field_0 + uVar32 * 4 + 0x20) = uVar33;
                                uVar41 = uVar41 ^ 1L << (uVar32 & 0x3f);
                                uVar32 = 0;
                                if (uVar41 != 0) {
                                  for (; (uVar41 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                                  }
                                }
                              } while (uVar41 != 0);
                            }
                            fVar69 = fVar69 + fVar94;
                            fVar100 = fVar100 + fVar96;
                            fVar132 = fVar132 + fVar98;
                            fVar108 = fVar108 + fVar104;
                            fVar136 = fVar136 + fVar106;
                            fVar111 = fVar111 + fVar115;
                            fVar119 = fVar119 + fVar117;
                            fVar121 = fVar121 + fVar126;
                            fVar139 = fVar139 + fVar129;
                            fVar142 = fVar142 + fVar147;
                            fVar145 = fVar145 + fVar153;
                            fVar187 = fVar187 + fVar154;
                            fVar155 = fVar155 + fVar109;
                            fVar182 = fVar182 + fVar128;
                            fVar185 = fVar185 + fVar131;
                            fVar70 = fVar70 + fVar134;
                            fVar72 = fVar72 + fVar49;
                            fVar82 = fVar82 + fVar66;
                            fVar83 = fVar83 + fVar68;
                            fVar84 = fVar84 + fVar71;
                            fVar158 = fVar158 + fVar86;
                            fVar162 = fVar162 + fVar95;
                            fVar166 = fVar166 + fVar97;
                            fVar170 = fVar170 + fVar99;
                            fStack_19d4 = fVar110 + fVar116;
                            local_19d8 = fVar101 + fVar107;
                            fStack_19d0 = fVar118 + fVar122;
                            fStack_19cc = fVar127 + fVar133;
                            local_1968 = local_1968 + fVar137;
                            fStack_1964 = fStack_1964 + fVar140;
                            fStack_1960 = fStack_1960 + fVar143;
                            fStack_195c = fStack_195c + fVar146;
                            fStack_19f4 = fVar112 + fVar163;
                            local_19f8 = fVar105 + fVar159;
                            fStack_19f0 = fVar120 + fVar167;
                            fStack_19ec = fVar130 + fVar171;
                            fVar94 = (float)p1.field_0._0_4_ * fVar135 +
                                     (float)p0.field_0._0_4_ * fVar48;
                            fVar96 = (float)p1.field_0._4_4_ * fVar138 +
                                     (float)p0.field_0._4_4_ * fVar65;
                            fVar98 = (float)p1.field_0._8_4_ * fVar141 +
                                     (float)p0.field_0._8_4_ * fVar67;
                            fVar104 = (float)p1.field_0._12_4_ * fVar144 +
                                      (float)p0.field_0._12_4_ * fVar85;
                            fVar106 = (float)p1.field_0._16_4_ * fVar135 +
                                      (float)p0.field_0._16_4_ * fVar48;
                            fVar115 = (float)p1.field_0._20_4_ * fVar138 +
                                      (float)p0.field_0._20_4_ * fVar65;
                            fVar117 = (float)p1.field_0._24_4_ * fVar141 +
                                      (float)p0.field_0._24_4_ * fVar67;
                            fVar126 = (float)p1.field_0._28_4_ * fVar144 +
                                      (float)p0.field_0._28_4_ * fVar85;
                            fVar135 = fVar135 * (float)p1.field_0._32_4_ +
                                      fVar48 * (float)p0.field_0._32_4_;
                            fVar138 = fVar138 * (float)p1.field_0._36_4_ +
                                      fVar65 * (float)p0.field_0._36_4_;
                            fVar141 = fVar141 * (float)p1.field_0._40_4_ +
                                      fVar67 * (float)p0.field_0._40_4_;
                            fVar144 = fVar144 * (float)p1.field_0._44_4_ +
                                      fVar85 * (float)p0.field_0._44_4_;
                          }
                          fVar101 = fVar69 - fVar155;
                          fVar105 = fVar100 - fVar182;
                          fVar107 = fVar132 - fVar185;
                          fVar110 = fVar108 - fVar70;
                          fVar49 = fVar136 - fVar72;
                          fVar66 = fVar111 - fVar82;
                          fVar68 = fVar119 - fVar83;
                          fVar71 = fVar121 - fVar84;
                          fVar86 = fVar139 - fVar158;
                          fVar95 = fVar142 - fVar162;
                          fVar97 = fVar145 - fVar166;
                          fVar99 = fVar187 - fVar170;
                          fVar180 = fVar94 - fVar69;
                          fVar183 = fVar96 - fVar100;
                          fVar184 = fVar98 - fVar132;
                          fVar186 = fVar104 - fVar108;
                          fVar188 = fVar106 - fVar136;
                          fVar189 = fVar115 - fVar111;
                          fVar190 = fVar117 - fVar119;
                          fVar191 = fVar126 - fVar121;
                          fVar159 = fVar135 - fVar139;
                          fVar163 = fVar138 - fVar142;
                          fVar167 = fVar141 - fVar145;
                          fVar171 = fVar144 - fVar187;
                          fVar122 = fVar188 * fVar86 - fVar49 * fVar159;
                          fVar127 = fVar189 * fVar95 - fVar66 * fVar163;
                          vVar151.field_0.v[1] = fVar127;
                          vVar151.field_0.v[0] = fVar122;
                          fVar130 = fVar190 * fVar97 - fVar68 * fVar167;
                          fVar133 = fVar191 * fVar99 - fVar71 * fVar171;
                          fVar137 = fVar101 * fVar159 - fVar180 * fVar86;
                          fVar140 = fVar105 * fVar163 - fVar183 * fVar95;
                          fVar143 = fVar107 * fVar167 - fVar184 * fVar97;
                          fVar146 = fVar110 * fVar171 - fVar186 * fVar99;
                          fVar112 = fVar180 * fVar49 - fVar101 * fVar188;
                          fVar116 = fVar183 * fVar66 - fVar105 * fVar189;
                          fVar118 = fVar184 * fVar68 - fVar107 * fVar190;
                          fVar120 = fVar186 * fVar71 - fVar110 * fVar191;
                          fVar69 = fVar69 - *(float *)ray;
                          fVar100 = fVar100 - *(float *)(ray + 4);
                          fVar132 = fVar132 - *(float *)(ray + 8);
                          fVar108 = fVar108 - *(float *)(ray + 0xc);
                          fVar136 = fVar136 - *(float *)(ray + 0x10);
                          fVar111 = fVar111 - *(float *)(ray + 0x14);
                          fVar119 = fVar119 - *(float *)(ray + 0x18);
                          fVar121 = fVar121 - *(float *)(ray + 0x1c);
                          fVar139 = fVar139 - *(float *)(ray + 0x20);
                          fVar142 = fVar142 - *(float *)(ray + 0x24);
                          fVar145 = fVar145 - *(float *)(ray + 0x28);
                          fVar187 = fVar187 - *(float *)(ray + 0x2c);
                          fVar48 = *(float *)(ray + 0x40);
                          fVar65 = *(float *)(ray + 0x44);
                          fVar67 = *(float *)(ray + 0x48);
                          fVar85 = *(float *)(ray + 0x4c);
                          fVar129 = *(float *)(ray + 0x50);
                          fVar147 = *(float *)(ray + 0x54);
                          fVar153 = *(float *)(ray + 0x58);
                          fVar154 = *(float *)(ray + 0x5c);
                          fVar109 = *(float *)(ray + 0x60);
                          fVar128 = *(float *)(ray + 100);
                          fVar131 = *(float *)(ray + 0x68);
                          fVar134 = *(float *)(ray + 0x6c);
                          fVar192 = fVar136 * fVar109 - fVar139 * fVar129;
                          fVar195 = fVar111 * fVar128 - fVar142 * fVar147;
                          fVar196 = fVar119 * fVar131 - fVar145 * fVar153;
                          fVar197 = fVar121 * fVar134 - fVar187 * fVar154;
                          fVar198 = fVar139 * fVar48 - fVar69 * fVar109;
                          fVar202 = fVar142 * fVar65 - fVar100 * fVar128;
                          fVar203 = fVar145 * fVar67 - fVar132 * fVar131;
                          fVar204 = fVar187 * fVar85 - fVar108 * fVar134;
                          fVar205 = fVar69 * fVar129 - fVar136 * fVar48;
                          fVar209 = fVar100 * fVar147 - fVar111 * fVar65;
                          fVar210 = fVar132 * fVar153 - fVar119 * fVar67;
                          fVar211 = fVar108 * fVar154 - fVar121 * fVar85;
                          fVar48 = fVar48 * fVar122 + fVar129 * fVar137 + fVar109 * fVar112;
                          fVar65 = fVar65 * fVar127 + fVar147 * fVar140 + fVar128 * fVar116;
                          fVar67 = fVar67 * fVar130 + fVar153 * fVar143 + fVar131 * fVar118;
                          fVar85 = fVar85 * fVar133 + fVar154 * fVar146 + fVar134 * fVar120;
                          uVar156 = (uint)fVar48 & 0x80000000;
                          uVar160 = (uint)fVar65 & 0x80000000;
                          uVar164 = (uint)fVar67 & 0x80000000;
                          uVar168 = (uint)fVar85 & 0x80000000;
                          fVar129 = (float)((uint)(fVar180 * fVar192 +
                                                  fVar188 * fVar198 + fVar159 * fVar205) ^ uVar156);
                          fVar147 = (float)((uint)(fVar183 * fVar195 +
                                                  fVar189 * fVar202 + fVar163 * fVar209) ^ uVar160);
                          fVar153 = (float)((uint)(fVar184 * fVar196 +
                                                  fVar190 * fVar203 + fVar167 * fVar210) ^ uVar164);
                          fVar154 = (float)((uint)(fVar186 * fVar197 +
                                                  fVar191 * fVar204 + fVar171 * fVar211) ^ uVar168);
                          uVar173 = -(uint)(0.0 <= fVar129) & local_19b8._0_4_;
                          uVar175 = -(uint)(0.0 <= fVar147) & local_19b8._4_4_;
                          uVar177 = -(uint)(0.0 <= fVar153) & local_19b8._8_4_;
                          uVar179 = -(uint)(0.0 <= fVar154) & local_19b8._12_4_;
                          auVar21._4_4_ = uVar175;
                          auVar21._0_4_ = uVar173;
                          auVar21._8_4_ = uVar177;
                          auVar21._12_4_ = uVar179;
                          iVar27 = movmskps((int)uVar32,auVar21);
                          if (iVar27 != 0) {
                            fVar109 = (float)((uint)(fVar101 * fVar192 +
                                                    fVar49 * fVar198 + fVar86 * fVar205) ^ uVar156);
                            fVar128 = (float)((uint)(fVar105 * fVar195 +
                                                    fVar66 * fVar202 + fVar95 * fVar209) ^ uVar160);
                            fVar131 = (float)((uint)(fVar107 * fVar196 +
                                                    fVar68 * fVar203 + fVar97 * fVar210) ^ uVar164);
                            fVar134 = (float)((uint)(fVar110 * fVar197 +
                                                    fVar71 * fVar204 + fVar99 * fVar211) ^ uVar168);
                            auVar193._0_4_ = -(uint)(0.0 <= fVar109) & uVar173;
                            auVar193._4_4_ = -(uint)(0.0 <= fVar128) & uVar175;
                            auVar193._8_4_ = -(uint)(0.0 <= fVar131) & uVar177;
                            auVar193._12_4_ = -(uint)(0.0 <= fVar134) & uVar179;
                            iVar27 = movmskps(iVar27,auVar193);
                            if (iVar27 != 0) {
                              fVar49 = ABS(fVar48);
                              fVar66 = ABS(fVar65);
                              fVar68 = ABS(fVar67);
                              fVar71 = ABS(fVar85);
                              uVar173 = -(uint)(fVar109 <= fVar49 - fVar129) & auVar193._0_4_;
                              uVar175 = -(uint)(fVar128 <= fVar66 - fVar147) & auVar193._4_4_;
                              uVar177 = -(uint)(fVar131 <= fVar68 - fVar153) & auVar193._8_4_;
                              uVar179 = -(uint)(fVar134 <= fVar71 - fVar154) & auVar193._12_4_;
                              auVar20._4_4_ = uVar175;
                              auVar20._0_4_ = uVar173;
                              auVar20._8_4_ = uVar177;
                              auVar20._12_4_ = uVar179;
                              iVar27 = movmskps(iVar27,auVar20);
                              if (iVar27 != 0) {
                                vVar151.field_0.v[2] = fVar130;
                                vVar151.field_0.v[3] = fVar133;
                                fVar69 = (float)(uVar156 ^
                                                (uint)(fVar69 * fVar122 +
                                                      fVar136 * fVar137 + fVar139 * fVar112));
                                fVar100 = (float)(uVar160 ^
                                                 (uint)(fVar100 * fVar127 +
                                                       fVar111 * fVar140 + fVar142 * fVar116));
                                fVar132 = (float)(uVar164 ^
                                                 (uint)(fVar132 * fVar130 +
                                                       fVar119 * fVar143 + fVar145 * fVar118));
                                fVar108 = (float)(uVar168 ^
                                                 (uint)(fVar108 * fVar133 +
                                                       fVar121 * fVar146 + fVar187 * fVar120));
                                pRVar1 = ray + 0x80;
                                auVar102 = *(undefined1 (*) [16])pRVar1;
                                auVar59._0_4_ =
                                     -(uint)(fVar69 <= fVar49 * *(float *)pRVar1 &&
                                            *(float *)(ray + 0x30) * fVar49 < fVar69) & uVar173;
                                auVar59._4_4_ =
                                     -(uint)(fVar100 <= fVar66 * *(float *)(ray + 0x84) &&
                                            *(float *)(ray + 0x34) * fVar66 < fVar100) & uVar175;
                                auVar59._8_4_ =
                                     -(uint)(fVar132 <= fVar68 * *(float *)(ray + 0x88) &&
                                            *(float *)(ray + 0x38) * fVar68 < fVar132) & uVar177;
                                auVar59._12_4_ =
                                     -(uint)(fVar108 <= fVar71 * *(float *)(ray + 0x8c) &&
                                            *(float *)(ray + 0x3c) * fVar71 < fVar108) & uVar179;
                                iVar27 = movmskps(iVar27,auVar59);
                                if (iVar27 != 0) {
                                  uVar156 = -(uint)(fVar48 != 0.0) & auVar59._0_4_;
                                  uVar160 = -(uint)(fVar65 != 0.0) & auVar59._4_4_;
                                  uVar164 = -(uint)(fVar67 != 0.0) & auVar59._8_4_;
                                  uVar168 = -(uint)(fVar85 != 0.0) & auVar59._12_4_;
                                  auVar15._4_4_ = uVar160;
                                  auVar15._0_4_ = uVar156;
                                  auVar15._8_4_ = uVar164;
                                  auVar15._12_4_ = uVar168;
                                  iVar27 = movmskps(iVar27,auVar15);
                                  if (iVar27 != 0) {
                                    uVar173 = pGVar4->mask;
                                    auVar77._0_4_ = -(uint)((uVar173 & *(uint *)(ray + 0x90)) == 0);
                                    auVar77._4_4_ = -(uint)((uVar173 & *(uint *)(ray + 0x94)) == 0);
                                    auVar77._8_4_ = -(uint)((uVar173 & *(uint *)(ray + 0x98)) == 0);
                                    auVar77._12_4_ = -(uint)((uVar173 & *(uint *)(ray + 0x9c)) == 0)
                                    ;
                                    auVar16._4_4_ = uVar160;
                                    auVar16._0_4_ = uVar156;
                                    auVar16._8_4_ = uVar164;
                                    auVar16._12_4_ = uVar168;
                                    aVar78 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                             (~auVar77 & auVar16);
                                    iVar27 = movmskps(iVar27,(undefined1  [16])aVar78);
                                    if (iVar27 != 0) {
                                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                         (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                        auVar23._4_4_ = fVar66;
                                        auVar23._0_4_ = fVar49;
                                        auVar23._8_4_ = fVar68;
                                        auVar23._12_4_ = fVar71;
                                        auVar51 = rcpps(ZEXT416(uVar173),auVar23);
                                        fVar136 = auVar51._0_4_;
                                        fVar111 = auVar51._4_4_;
                                        fVar119 = auVar51._8_4_;
                                        fVar121 = auVar51._12_4_;
                                        fVar139 = (float)DAT_01feca10;
                                        fVar142 = DAT_01feca10._4_4_;
                                        fVar145 = DAT_01feca10._8_4_;
                                        fVar187 = DAT_01feca10._12_4_;
                                        fVar136 = (fVar139 - fVar49 * fVar136) * fVar136 + fVar136;
                                        fVar111 = (fVar142 - fVar66 * fVar111) * fVar111 + fVar111;
                                        fVar119 = (fVar145 - fVar68 * fVar119) * fVar119 + fVar119;
                                        fVar121 = (fVar187 - fVar71 * fVar121) * fVar121 + fVar121;
                                        auVar181._0_4_ = fVar129 * fVar136;
                                        auVar181._4_4_ = fVar147 * fVar111;
                                        auVar181._8_4_ = fVar153 * fVar119;
                                        auVar181._12_4_ = fVar154 * fVar121;
                                        auVar201 = minps(auVar181,_DAT_01feca10);
                                        auVar124._0_4_ = fVar109 * fVar136;
                                        auVar124._4_4_ = fVar128 * fVar111;
                                        auVar124._8_4_ = fVar131 * fVar119;
                                        auVar124._12_4_ = fVar134 * fVar121;
                                        auVar51 = minps(auVar124,_DAT_01feca10);
                                        auVar103._0_4_ = fVar139 - auVar201._0_4_;
                                        auVar103._4_4_ = fVar142 - auVar201._4_4_;
                                        auVar103._8_4_ = fVar145 - auVar201._8_4_;
                                        auVar103._12_4_ = fVar187 - auVar201._12_4_;
                                        auVar24._8_8_ = uVar26;
                                        auVar24._0_8_ = uVar25;
                                        blendvps(auVar201,auVar103,auVar24);
                                        auVar17._4_4_ = fVar142 - auVar51._4_4_;
                                        auVar17._0_4_ = fVar139 - auVar51._0_4_;
                                        auVar17._8_4_ = fVar145 - auVar51._8_4_;
                                        auVar17._12_4_ = fVar187 - auVar51._12_4_;
                                        blendvps(auVar51,auVar17,auVar24);
                                        p0.field_0.field_0.x.field_0 =
                                             (vfloat_impl<4>)(vfloat_impl<4>)vVar151.field_0;
                                        p0.field_0._20_4_ = fVar140;
                                        p0.field_0._16_4_ = fVar137;
                                        p0.field_0._28_4_ = fVar146;
                                        p0.field_0._24_4_ = fVar143;
                                        p0.field_0._36_4_ = fVar116;
                                        p0.field_0._32_4_ = fVar112;
                                        p0.field_0._40_4_ = fVar118;
                                        p0.field_0._44_4_ = fVar120;
                                        auVar89._0_4_ = fVar136 * fVar69;
                                        auVar89._4_4_ = fVar111 * fVar100;
                                        auVar89._8_4_ = fVar119 * fVar132;
                                        auVar89._12_4_ = fVar121 * fVar108;
                                        auVar51 = blendvps(*(undefined1 (*) [16])pRVar1,auVar89,
                                                           (undefined1  [16])aVar78);
                                        *(undefined1 (*) [16])(ray + 0x80) = auVar51;
                                        itime.field_0 = aVar78;
                                        p1.field_0._0_8_ = &itime;
                                        p1.field_0._8_8_ = pGVar4->userPtr;
                                        p1.field_0._16_8_ = context->user;
                                        p1.field_0._24_8_ = ray;
                                        p1.field_0._32_8_ = &p0;
                                        p1.field_0._40_4_ = 4;
                                        uVar33 = pGVar4->occlusionFilterN;
                                        if ((RTCFilterFunctionN)uVar33 != (RTCFilterFunctionN)0x0) {
                                          valid_i = (vint<4> *)&p1;
                                          uVar33 = (*(code *)uVar33)((RTCFilterFunctionNArguments *)
                                                                     valid_i);
                                        }
                                        if (itime.field_0 ==
                                            (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0) {
                                          auVar90._8_4_ = 0xffffffff;
                                          auVar90._0_8_ = 0xffffffffffffffff;
                                          auVar90._12_4_ = 0xffffffff;
                                          auVar90 = auVar90 ^ _DAT_01febe20;
                                        }
                                        else {
                                          p_Var6 = context->args->filter;
                                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                             (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                            valid_i = (vint<4> *)&p1;
                                            (*p_Var6)((RTCFilterFunctionNArguments *)valid_i);
                                          }
                                          auVar61._0_4_ = -(uint)(itime.field_0.i[0] == 0);
                                          auVar61._4_4_ = -(uint)(itime.field_0.i[1] == 0);
                                          auVar61._8_4_ = -(uint)(itime.field_0.i[2] == 0);
                                          auVar61._12_4_ = -(uint)(itime.field_0.i[3] == 0);
                                          auVar90 = auVar61 ^ _DAT_01febe20;
                                          auVar51 = blendvps(_DAT_01feba00,
                                                             *(undefined1 (*) [16])
                                                              (p1.field_0._24_8_ + 0x80),auVar61);
                                          *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar51
                                          ;
                                          uVar33 = p1.field_0._24_8_;
                                        }
                                        uVar28 = (uint)uVar33;
                                        auVar92._0_4_ = auVar90._0_4_ << 0x1f;
                                        auVar92._4_4_ = auVar90._4_4_ << 0x1f;
                                        auVar92._8_4_ = auVar90._8_4_ << 0x1f;
                                        auVar92._12_4_ = auVar90._12_4_ << 0x1f;
                                        aVar78._0_4_ = auVar92._0_4_ >> 0x1f;
                                        aVar78._4_4_ = auVar92._4_4_ >> 0x1f;
                                        aVar78._8_4_ = auVar92._8_4_ >> 0x1f;
                                        aVar78._12_4_ = auVar92._12_4_ >> 0x1f;
                                        auVar102 = blendvps(auVar102,*(undefined1 (*) [16])
                                                                      (ray + 0x80),auVar92);
                                        *(undefined1 (*) [16])(ray + 0x80) = auVar102;
                                      }
                                      local_19b8 = ~(undefined1  [16])aVar78 & local_19b8;
                                    }
                                  }
                                }
                              }
                            }
                          }
                          fVar69 = local_19d8;
                          fVar100 = local_19d8._4_4_;
                          fVar132 = local_19d8._8_4_;
                          fVar108 = local_19d8._12_4_;
                          iVar27 = movmskps(uVar28,local_19b8);
                          if (iVar27 == 0) {
                            uVar28 = 0;
                          }
                          else {
                            fVar94 = fVar69 - fVar94;
                            fVar96 = fVar100 - fVar96;
                            fVar98 = fVar132 - fVar98;
                            fVar104 = fVar108 - fVar104;
                            fVar106 = local_1968 - fVar106;
                            fVar115 = fStack_1964 - fVar115;
                            fVar117 = fStack_1960 - fVar117;
                            fVar126 = fStack_195c - fVar126;
                            fVar135 = local_19f8 - fVar135;
                            fVar138 = fStack_19f4 - fVar138;
                            fVar141 = fStack_19f0 - fVar141;
                            fVar144 = fStack_19ec - fVar144;
                            fVar155 = fVar155 - fVar69;
                            fVar182 = fVar182 - fVar100;
                            fVar185 = fVar185 - fVar132;
                            fVar70 = fVar70 - fVar108;
                            fVar72 = fVar72 - local_1968;
                            fVar82 = fVar82 - fStack_1964;
                            fVar83 = fVar83 - fStack_1960;
                            fVar84 = fVar84 - fStack_195c;
                            fVar158 = fVar158 - local_19f8;
                            fVar162 = fVar162 - fStack_19f4;
                            fVar166 = fVar166 - fStack_19f0;
                            fVar170 = fVar170 - fStack_19ec;
                            fVar49 = fVar135 * fVar72 - fVar106 * fVar158;
                            fVar66 = fVar138 * fVar82 - fVar115 * fVar162;
                            vVar19.field_0.v[1] = fVar66;
                            vVar19.field_0.v[0] = fVar49;
                            fVar68 = fVar141 * fVar83 - fVar117 * fVar166;
                            fVar71 = fVar144 * fVar84 - fVar126 * fVar170;
                            fVar109 = fVar94 * fVar158 - fVar135 * fVar155;
                            fVar128 = fVar96 * fVar162 - fVar138 * fVar182;
                            vVar22.field_0.v[1] = fVar128;
                            vVar22.field_0.v[0] = fVar109;
                            fVar131 = fVar98 * fVar166 - fVar141 * fVar185;
                            fVar134 = fVar104 * fVar170 - fVar144 * fVar70;
                            fVar129 = fVar106 * fVar155 - fVar94 * fVar72;
                            fVar147 = fVar115 * fVar182 - fVar96 * fVar82;
                            vVar194.field_0.v[1] = fVar147;
                            vVar194.field_0.v[0] = fVar129;
                            fVar153 = fVar117 * fVar185 - fVar98 * fVar83;
                            fVar154 = fVar126 * fVar70 - fVar104 * fVar84;
                            fVar69 = fVar69 - *(float *)ray;
                            fVar100 = fVar100 - *(float *)(ray + 4);
                            fVar132 = fVar132 - *(float *)(ray + 8);
                            fVar108 = fVar108 - *(float *)(ray + 0xc);
                            local_1968 = local_1968 - *(float *)(ray + 0x10);
                            fStack_1964 = fStack_1964 - *(float *)(ray + 0x14);
                            fStack_1960 = fStack_1960 - *(float *)(ray + 0x18);
                            fStack_195c = fStack_195c - *(float *)(ray + 0x1c);
                            local_19f8 = local_19f8 - *(float *)(ray + 0x20);
                            fStack_19f4 = fStack_19f4 - *(float *)(ray + 0x24);
                            fStack_19f0 = fStack_19f0 - *(float *)(ray + 0x28);
                            fStack_19ec = fStack_19ec - *(float *)(ray + 0x2c);
                            fVar136 = *(float *)(ray + 0x40);
                            fVar111 = *(float *)(ray + 0x44);
                            fVar119 = *(float *)(ray + 0x48);
                            fVar121 = *(float *)(ray + 0x4c);
                            fVar139 = *(float *)(ray + 0x50);
                            fVar142 = *(float *)(ray + 0x54);
                            fVar145 = *(float *)(ray + 0x58);
                            fVar187 = *(float *)(ray + 0x5c);
                            fVar48 = *(float *)(ray + 0x60);
                            fVar65 = *(float *)(ray + 100);
                            fVar67 = *(float *)(ray + 0x68);
                            fVar85 = *(float *)(ray + 0x6c);
                            fVar86 = local_1968 * fVar48 - local_19f8 * fVar139;
                            fVar95 = fStack_1964 * fVar65 - fStack_19f4 * fVar142;
                            fVar97 = fStack_1960 * fVar67 - fStack_19f0 * fVar145;
                            fVar99 = fStack_195c * fVar85 - fStack_19ec * fVar187;
                            fVar101 = local_19f8 * fVar136 - fVar69 * fVar48;
                            fVar105 = fStack_19f4 * fVar111 - fVar100 * fVar65;
                            fVar107 = fStack_19f0 * fVar119 - fVar132 * fVar67;
                            fVar110 = fStack_19ec * fVar121 - fVar108 * fVar85;
                            fVar112 = fVar69 * fVar139 - local_1968 * fVar136;
                            fVar116 = fVar100 * fVar142 - fStack_1964 * fVar111;
                            fVar118 = fVar132 * fVar145 - fStack_1960 * fVar119;
                            fVar120 = fVar108 * fVar187 - fStack_195c * fVar121;
                            fVar136 = fVar136 * fVar49 + fVar139 * fVar109 + fVar48 * fVar129;
                            fVar111 = fVar111 * fVar66 + fVar142 * fVar128 + fVar65 * fVar147;
                            fVar119 = fVar119 * fVar68 + fVar145 * fVar131 + fVar67 * fVar153;
                            fVar121 = fVar121 * fVar71 + fVar187 * fVar134 + fVar85 * fVar154;
                            uVar156 = (uint)fVar136 & 0x80000000;
                            uVar160 = (uint)fVar111 & 0x80000000;
                            uVar164 = (uint)fVar119 & 0x80000000;
                            uVar168 = (uint)fVar121 & 0x80000000;
                            fVar139 = (float)((uint)(fVar155 * fVar86 +
                                                    fVar72 * fVar101 + fVar158 * fVar112) ^ uVar156)
                            ;
                            fVar142 = (float)((uint)(fVar182 * fVar95 +
                                                    fVar82 * fVar105 + fVar162 * fVar116) ^ uVar160)
                            ;
                            fVar145 = (float)((uint)(fVar185 * fVar97 +
                                                    fVar83 * fVar107 + fVar166 * fVar118) ^ uVar164)
                            ;
                            fVar187 = (float)((uint)(fVar70 * fVar99 +
                                                    fVar84 * fVar110 + fVar170 * fVar120) ^ uVar168)
                            ;
                            uVar173 = -(uint)(0.0 <= fVar139) & local_19b8._0_4_;
                            uVar175 = -(uint)(0.0 <= fVar142) & local_19b8._4_4_;
                            uVar177 = -(uint)(0.0 <= fVar145) & local_19b8._8_4_;
                            uVar179 = -(uint)(0.0 <= fVar187) & local_19b8._12_4_;
                            auVar18._4_4_ = uVar175;
                            auVar18._0_4_ = uVar173;
                            auVar18._8_4_ = uVar177;
                            auVar18._12_4_ = uVar179;
                            uVar28 = movmskps(iVar27,auVar18);
                            if (uVar28 != 0) {
                              fVar135 = (float)((uint)(fVar94 * fVar86 +
                                                      fVar106 * fVar101 + fVar135 * fVar112) ^
                                               uVar156);
                              fVar138 = (float)((uint)(fVar96 * fVar95 +
                                                      fVar115 * fVar105 + fVar138 * fVar116) ^
                                               uVar160);
                              fVar141 = (float)((uint)(fVar98 * fVar97 +
                                                      fVar117 * fVar107 + fVar141 * fVar118) ^
                                               uVar164);
                              fVar144 = (float)((uint)(fVar104 * fVar99 +
                                                      fVar126 * fVar110 + fVar144 * fVar120) ^
                                               uVar168);
                              uVar173 = -(uint)(0.0 <= fVar135) & uVar173;
                              uVar175 = -(uint)(0.0 <= fVar138) & uVar175;
                              uVar177 = -(uint)(0.0 <= fVar141) & uVar177;
                              uVar179 = -(uint)(0.0 <= fVar144) & uVar179;
                              auVar11._4_4_ = uVar175;
                              auVar11._0_4_ = uVar173;
                              auVar11._8_4_ = uVar177;
                              auVar11._12_4_ = uVar179;
                              uVar28 = movmskps(uVar28,auVar11);
                              if (uVar28 != 0) {
                                vVar194.field_0.v[2] = fVar153;
                                vVar194.field_0.v[3] = fVar154;
                                fVar48 = ABS(fVar136);
                                fVar65 = ABS(fVar111);
                                auVar150._0_8_ = CONCAT44(fVar111,fVar136) & 0x7fffffff7fffffff;
                                auVar150._8_4_ = ABS(fVar119);
                                auVar150._12_4_ = ABS(fVar121);
                                auVar76._0_4_ = -(uint)(fVar135 <= fVar48 - fVar139) & uVar173;
                                auVar76._4_4_ = -(uint)(fVar138 <= fVar65 - fVar142) & uVar175;
                                auVar76._8_4_ =
                                     -(uint)(fVar141 <= auVar150._8_4_ - fVar145) & uVar177;
                                auVar76._12_4_ =
                                     -(uint)(fVar144 <= auVar150._12_4_ - fVar187) & uVar179;
                                uVar28 = movmskps(uVar28,auVar76);
                                if (uVar28 != 0) {
                                  fVar69 = (float)(uVar156 ^
                                                  (uint)(fVar69 * fVar49 +
                                                        local_1968 * fVar109 + local_19f8 * fVar129)
                                                  );
                                  fVar100 = (float)(uVar160 ^
                                                   (uint)(fVar100 * fVar66 +
                                                         fStack_1964 * fVar128 +
                                                         fStack_19f4 * fVar147));
                                  fVar132 = (float)(uVar164 ^
                                                   (uint)(fVar132 * fVar68 +
                                                         fStack_1960 * fVar131 +
                                                         fStack_19f0 * fVar153));
                                  fVar108 = (float)(uVar168 ^
                                                   (uint)(fVar108 * fVar71 +
                                                         fStack_195c * fVar134 +
                                                         fStack_19ec * fVar154));
                                  auVar102 = *(undefined1 (*) [16])(ray + 0x80);
                                  uVar156 = -(uint)(fVar69 <= fVar48 * auVar102._0_4_ &&
                                                   *(float *)(ray + 0x30) * fVar48 < fVar69) &
                                            auVar76._0_4_;
                                  uVar160 = -(uint)(fVar100 <= fVar65 * auVar102._4_4_ &&
                                                   *(float *)(ray + 0x34) * fVar65 < fVar100) &
                                            auVar76._4_4_;
                                  uVar164 = -(uint)(fVar132 <= auVar150._8_4_ * auVar102._8_4_ &&
                                                   *(float *)(ray + 0x38) * auVar150._8_4_ < fVar132
                                                   ) & auVar76._8_4_;
                                  uVar168 = -(uint)(fVar108 <= auVar150._12_4_ * auVar102._12_4_ &&
                                                   *(float *)(ray + 0x3c) * auVar150._12_4_ <
                                                   fVar108) & auVar76._12_4_;
                                  auVar12._4_4_ = uVar160;
                                  auVar12._0_4_ = uVar156;
                                  auVar12._8_4_ = uVar164;
                                  auVar12._12_4_ = uVar168;
                                  uVar28 = movmskps(uVar28,auVar12);
                                  if (uVar28 != 0) {
                                    auVar60._0_4_ = -(uint)(fVar136 != 0.0) & uVar156;
                                    auVar60._4_4_ = -(uint)(fVar111 != 0.0) & uVar160;
                                    auVar60._8_4_ = -(uint)(fVar119 != 0.0) & uVar164;
                                    auVar60._12_4_ = -(uint)(fVar121 != 0.0) & uVar168;
                                    uVar28 = movmskps(uVar28,auVar60);
                                    if (uVar28 != 0) {
                                      uVar28 = *(uint *)(lVar42 + 0x40 + uVar37 * 4);
                                      pGVar4 = (context->scene->geometries).items[uVar28].ptr;
                                      uVar156 = pGVar4->mask;
                                      auVar79._0_4_ =
                                           -(uint)((uVar156 & *(uint *)(ray + 0x90)) == 0);
                                      auVar79._4_4_ =
                                           -(uint)((uVar156 & *(uint *)(ray + 0x94)) == 0);
                                      auVar79._8_4_ =
                                           -(uint)((uVar156 & *(uint *)(ray + 0x98)) == 0);
                                      auVar79._12_4_ =
                                           -(uint)((uVar156 & *(uint *)(ray + 0x9c)) == 0);
                                      aVar80 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                               (~auVar79 & auVar60);
                                      iVar27 = movmskps((int)pGVar4,(undefined1  [16])aVar80);
                                      if (iVar27 != 0) {
                                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                           (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                          auVar51 = rcpps(auVar60,auVar150);
                                          fVar136 = auVar51._0_4_;
                                          fVar111 = auVar51._4_4_;
                                          fVar119 = auVar51._8_4_;
                                          fVar121 = auVar51._12_4_;
                                          fVar67 = (float)DAT_01feca10;
                                          fVar85 = DAT_01feca10._4_4_;
                                          fVar94 = DAT_01feca10._8_4_;
                                          fVar96 = DAT_01feca10._12_4_;
                                          fVar136 = (fVar67 - fVar48 * fVar136) * fVar136 + fVar136;
                                          fVar111 = (fVar85 - fVar65 * fVar111) * fVar111 + fVar111;
                                          fVar119 = (fVar94 - auVar150._8_4_ * fVar119) * fVar119 +
                                                    fVar119;
                                          fVar121 = (fVar96 - auVar150._12_4_ * fVar121) * fVar121 +
                                                    fVar121;
                                          auVar200._0_4_ = fVar139 * fVar136;
                                          auVar200._4_4_ = fVar142 * fVar111;
                                          auVar200._8_4_ = fVar145 * fVar119;
                                          auVar200._12_4_ = fVar187 * fVar121;
                                          auVar201 = minps(auVar200,_DAT_01feca10);
                                          auVar125._0_4_ = fVar135 * fVar136;
                                          auVar125._4_4_ = fVar138 * fVar111;
                                          auVar125._8_4_ = fVar141 * fVar119;
                                          auVar125._12_4_ = fVar144 * fVar121;
                                          auVar51 = minps(auVar125,_DAT_01feca10);
                                          auVar152._0_4_ = fVar67 - auVar201._0_4_;
                                          auVar152._4_4_ = fVar85 - auVar201._4_4_;
                                          auVar152._8_4_ = fVar94 - auVar201._8_4_;
                                          auVar152._12_4_ = fVar96 - auVar201._12_4_;
                                          blendvps(auVar201,auVar152,auVar81);
                                          auVar14._4_4_ = fVar85 - auVar51._4_4_;
                                          auVar14._0_4_ = fVar67 - auVar51._0_4_;
                                          auVar14._8_4_ = fVar94 - auVar51._8_4_;
                                          auVar14._12_4_ = fVar96 - auVar51._12_4_;
                                          blendvps(auVar51,auVar14,auVar81);
                                          vVar19.field_0.v[2] = fVar68;
                                          vVar19.field_0.v[3] = fVar71;
                                          p0.field_0.field_0.x.field_0 =
                                               (vfloat_impl<4>)(vfloat_impl<4>)vVar19.field_0;
                                          vVar22.field_0.v[2] = fVar131;
                                          vVar22.field_0.v[3] = fVar134;
                                          p0.field_0.field_0.y.field_0 =
                                               (vfloat_impl<4>)(vfloat_impl<4>)vVar22.field_0;
                                          p0.field_0.field_0.z.field_0 =
                                               (vfloat_impl<4>)(vfloat_impl<4>)vVar194.field_0;
                                          auVar13._4_4_ = fVar111 * fVar100;
                                          auVar13._0_4_ = fVar136 * fVar69;
                                          auVar13._8_4_ = fVar119 * fVar132;
                                          auVar13._12_4_ = fVar121 * fVar108;
                                          auVar51 = blendvps(auVar102,auVar13,
                                                             (undefined1  [16])aVar80);
                                          *(undefined1 (*) [16])(ray + 0x80) = auVar51;
                                          itime.field_0 = aVar80;
                                          p1.field_0._0_8_ = &itime;
                                          p1.field_0._8_8_ = pGVar4->userPtr;
                                          p1.field_0._16_8_ = context->user;
                                          p1.field_0._24_8_ = ray;
                                          p1.field_0._32_8_ = &p0;
                                          p1.field_0._40_4_ = 4;
                                          uVar33 = pGVar4->occlusionFilterN;
                                          if ((RTCFilterFunctionN)uVar33 != (RTCFilterFunctionN)0x0)
                                          {
                                            valid_i = (vint<4> *)&p1;
                                            uVar33 = (*(code *)uVar33)((RTCFilterFunctionNArguments
                                                                        *)valid_i);
                                          }
                                          if (itime.field_0 ==
                                              (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0) {
                                            auVar91._8_4_ = 0xffffffff;
                                            auVar91._0_8_ = 0xffffffffffffffff;
                                            auVar91._12_4_ = 0xffffffff;
                                            auVar91 = auVar91 ^ _DAT_01febe20;
                                          }
                                          else {
                                            p_Var6 = context->args->filter;
                                            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                               (((context->args->flags &
                                                 RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                                 RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                              valid_i = (vint<4> *)&p1;
                                              (*p_Var6)((RTCFilterFunctionNArguments *)valid_i);
                                            }
                                            auVar62._0_4_ = -(uint)(itime.field_0.i[0] == 0);
                                            auVar62._4_4_ = -(uint)(itime.field_0.i[1] == 0);
                                            auVar62._8_4_ = -(uint)(itime.field_0.i[2] == 0);
                                            auVar62._12_4_ = -(uint)(itime.field_0.i[3] == 0);
                                            auVar91 = auVar62 ^ _DAT_01febe20;
                                            auVar51 = blendvps(_DAT_01feba00,
                                                               *(undefined1 (*) [16])
                                                                (p1.field_0._24_8_ + 0x80),auVar62);
                                            *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) =
                                                 auVar51;
                                            uVar33 = p1.field_0._24_8_;
                                          }
                                          uVar28 = (uint)uVar33;
                                          auVar93._0_4_ = auVar91._0_4_ << 0x1f;
                                          auVar93._4_4_ = auVar91._4_4_ << 0x1f;
                                          auVar93._8_4_ = auVar91._8_4_ << 0x1f;
                                          auVar93._12_4_ = auVar91._12_4_ << 0x1f;
                                          aVar80._0_4_ = auVar93._0_4_ >> 0x1f;
                                          aVar80._4_4_ = auVar93._4_4_ >> 0x1f;
                                          aVar80._8_4_ = auVar93._8_4_ >> 0x1f;
                                          aVar80._12_4_ = auVar93._12_4_ >> 0x1f;
                                          auVar102 = blendvps(auVar102,*(undefined1 (*) [16])
                                                                        (ray + 0x80),auVar93);
                                          *(undefined1 (*) [16])(ray + 0x80) = auVar102;
                                        }
                                        local_19b8 = ~(undefined1  [16])aVar80 & local_19b8;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                            iVar27 = movmskps(uVar28,local_19b8);
                            uVar28 = CONCAT31((int3)((uint)iVar27 >> 8),iVar27 != 0);
                          }
                          uVar32 = (ulong)uVar28;
                          aVar208 = _DAT_01feb9f0;
                          if (((char)uVar28 == '\0') ||
                             (uVar32 = uVar37 + 1, bVar47 = 2 < uVar37, uVar37 = uVar32, bVar47))
                          break;
                        }
                        auVar63._0_4_ = auVar58._0_4_ & local_19b8._0_4_;
                        auVar63._4_4_ = auVar58._4_4_ & local_19b8._4_4_;
                        auVar63._8_4_ = auVar58._8_4_ & local_19b8._8_4_;
                        auVar63._12_4_ = auVar58._12_4_ & local_19b8._12_4_;
                        iVar27 = movmskps((int)uVar32,auVar63);
                      } while ((iVar27 != 0) &&
                              (uVar29 = uVar29 + 1, auVar58 = auVar63, uVar29 < uVar30));
                      uVar30 = CONCAT44(auVar63._4_4_,auVar63._0_4_);
                      aVar64._0_8_ = uVar30 ^ 0xffffffffffffffff;
                      aVar64._8_4_ = auVar63._8_4_ ^ 0xffffffff;
                      aVar64._12_4_ = auVar63._12_4_ ^ 0xffffffff;
                    }
                    terminated.field_0 =
                         (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                         ((undefined1  [16])aVar64 | (undefined1  [16])terminated.field_0);
                    iVar27 = movmskps((int)uVar29,(undefined1  [16])terminated.field_0);
                    if (iVar27 == 0xf) goto LAB_0024cc99;
                    tray.tfar.field_0 =
                         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                                  (undefined1  [16])terminated.field_0);
                    iVar27 = 0;
                    break;
                  }
                  goto LAB_0024ccaa;
                }
                uVar29 = root.ptr & 0xfffffffffffffff0;
                uVar28 = (uint)root.ptr & 7;
                pIVar36 = (Intersectors *)0x0;
                sVar45 = 8;
                aVar199 = aVar208;
                do {
                  sVar3 = *(size_t *)(uVar29 + (long)pIVar36 * 8);
                  root.ptr = sVar45;
                  aVar87 = aVar199;
                  if (sVar3 != 8) {
                    fVar69 = *(float *)(uVar29 + 0x80 + (long)pIVar36 * 4);
                    fVar100 = *(float *)(uVar29 + 0x20 + (long)pIVar36 * 4);
                    fVar132 = *(float *)(uVar29 + 0x30 + (long)pIVar36 * 4);
                    fVar108 = *(float *)(uVar29 + 0x40 + (long)pIVar36 * 4);
                    fVar136 = *(float *)(uVar29 + 0x50 + (long)pIVar36 * 4);
                    auVar102 = *(undefined1 (*) [16])(ray + 0x70);
                    fVar85 = auVar102._0_4_;
                    fVar94 = auVar102._4_4_;
                    fVar96 = auVar102._8_4_;
                    fVar98 = auVar102._12_4_;
                    fVar111 = *(float *)(uVar29 + 0xa0 + (long)pIVar36 * 4);
                    fVar119 = *(float *)(uVar29 + 0xc0 + (long)pIVar36 * 4);
                    fVar121 = *(float *)(uVar29 + 0x60 + (long)pIVar36 * 4);
                    fVar139 = *(float *)(uVar29 + 0x90 + (long)pIVar36 * 4);
                    fVar142 = *(float *)(uVar29 + 0xb0 + (long)pIVar36 * 4);
                    fVar145 = *(float *)(uVar29 + 0xd0 + (long)pIVar36 * 4);
                    fVar187 = *(float *)(uVar29 + 0x70 + (long)pIVar36 * 4);
                    fVar182 = (float)((ulong)tray.org.field_0._32_8_ >> 0x20);
                    fVar185 = (float)((ulong)tray.org.field_0._40_8_ >> 0x20);
                    fVar48 = ((fVar69 * fVar85 + fVar100) - (float)tray.org.field_0._0_4_) *
                             (float)tray.rdir.field_0._0_4_;
                    fVar65 = ((fVar69 * fVar94 + fVar100) - (float)tray.org.field_0._4_4_) *
                             (float)tray.rdir.field_0._4_4_;
                    fVar67 = ((fVar69 * fVar96 + fVar100) - (float)tray.org.field_0._8_4_) *
                             (float)tray.rdir.field_0._8_4_;
                    fVar69 = ((fVar69 * fVar98 + fVar100) - (float)tray.org.field_0._12_4_) *
                             (float)tray.rdir.field_0._12_4_;
                    fVar100 = ((fVar111 * fVar85 + fVar108) - (float)tray.org.field_0._16_4_) *
                              (float)tray.rdir.field_0._16_4_;
                    fVar104 = ((fVar111 * fVar94 + fVar108) - (float)tray.org.field_0._20_4_) *
                              (float)tray.rdir.field_0._20_4_;
                    fVar106 = ((fVar111 * fVar96 + fVar108) - (float)tray.org.field_0._24_4_) *
                              (float)tray.rdir.field_0._24_4_;
                    fVar108 = ((fVar111 * fVar98 + fVar108) - (float)tray.org.field_0._28_4_) *
                              (float)tray.rdir.field_0._28_4_;
                    fVar111 = ((fVar119 * fVar85 + fVar121) - (float)tray.org.field_0._32_8_) *
                              (float)tray.rdir.field_0._32_4_;
                    fVar115 = ((fVar119 * fVar94 + fVar121) - fVar182) *
                              (float)tray.rdir.field_0._36_4_;
                    fVar117 = ((fVar119 * fVar96 + fVar121) - (float)tray.org.field_0._40_8_) *
                              (float)tray.rdir.field_0._40_4_;
                    fVar119 = ((fVar119 * fVar98 + fVar121) - fVar185) *
                              (float)tray.rdir.field_0._44_4_;
                    fVar121 = ((fVar139 * fVar85 + fVar132) - (float)tray.org.field_0._0_4_) *
                              (float)tray.rdir.field_0._0_4_;
                    fVar126 = ((fVar139 * fVar94 + fVar132) - (float)tray.org.field_0._4_4_) *
                              (float)tray.rdir.field_0._4_4_;
                    fVar129 = ((fVar139 * fVar96 + fVar132) - (float)tray.org.field_0._8_4_) *
                              (float)tray.rdir.field_0._8_4_;
                    fVar132 = ((fVar139 * fVar98 + fVar132) - (float)tray.org.field_0._12_4_) *
                              (float)tray.rdir.field_0._12_4_;
                    fVar147 = ((fVar142 * fVar85 + fVar136) - (float)tray.org.field_0._16_4_) *
                              (float)tray.rdir.field_0._16_4_;
                    fVar153 = ((fVar142 * fVar94 + fVar136) - (float)tray.org.field_0._20_4_) *
                              (float)tray.rdir.field_0._20_4_;
                    fVar154 = ((fVar142 * fVar96 + fVar136) - (float)tray.org.field_0._24_4_) *
                              (float)tray.rdir.field_0._24_4_;
                    fVar155 = ((fVar142 * fVar98 + fVar136) - (float)tray.org.field_0._28_4_) *
                              (float)tray.rdir.field_0._28_4_;
                    fVar136 = ((fVar145 * fVar85 + fVar187) - (float)tray.org.field_0._32_8_) *
                              (float)tray.rdir.field_0._32_4_;
                    fVar139 = ((fVar145 * fVar94 + fVar187) - fVar182) *
                              (float)tray.rdir.field_0._36_4_;
                    fVar142 = ((fVar145 * fVar96 + fVar187) - (float)tray.org.field_0._40_8_) *
                              (float)tray.rdir.field_0._40_4_;
                    fVar145 = ((fVar145 * fVar98 + fVar187) - fVar185) *
                              (float)tray.rdir.field_0._44_4_;
                    uVar156 = (uint)((int)fVar121 < (int)fVar48) * (int)fVar121 |
                              (uint)((int)fVar121 >= (int)fVar48) * (int)fVar48;
                    uVar160 = (uint)((int)fVar126 < (int)fVar65) * (int)fVar126 |
                              (uint)((int)fVar126 >= (int)fVar65) * (int)fVar65;
                    uVar164 = (uint)((int)fVar129 < (int)fVar67) * (int)fVar129 |
                              (uint)((int)fVar129 >= (int)fVar67) * (int)fVar67;
                    uVar168 = (uint)((int)fVar132 < (int)fVar69) * (int)fVar132 |
                              (uint)((int)fVar132 >= (int)fVar69) * (int)fVar69;
                    uVar173 = (uint)((int)fVar147 < (int)fVar100) * (int)fVar147 |
                              (uint)((int)fVar147 >= (int)fVar100) * (int)fVar100;
                    uVar175 = (uint)((int)fVar153 < (int)fVar104) * (int)fVar153 |
                              (uint)((int)fVar153 >= (int)fVar104) * (int)fVar104;
                    uVar177 = (uint)((int)fVar154 < (int)fVar106) * (int)fVar154 |
                              (uint)((int)fVar154 >= (int)fVar106) * (int)fVar106;
                    uVar179 = (uint)((int)fVar155 < (int)fVar108) * (int)fVar155 |
                              (uint)((int)fVar155 >= (int)fVar108) * (int)fVar108;
                    uVar173 = ((int)uVar173 < (int)uVar156) * uVar156 |
                              ((int)uVar173 >= (int)uVar156) * uVar173;
                    uVar175 = ((int)uVar175 < (int)uVar160) * uVar160 |
                              ((int)uVar175 >= (int)uVar160) * uVar175;
                    uVar177 = ((int)uVar177 < (int)uVar164) * uVar164 |
                              ((int)uVar177 >= (int)uVar164) * uVar177;
                    uVar179 = ((int)uVar179 < (int)uVar168) * uVar168 |
                              ((int)uVar179 >= (int)uVar168) * uVar179;
                    uVar156 = (uint)((int)fVar136 < (int)fVar111) * (int)fVar136 |
                              (uint)((int)fVar136 >= (int)fVar111) * (int)fVar111;
                    uVar160 = (uint)((int)fVar139 < (int)fVar115) * (int)fVar139 |
                              (uint)((int)fVar139 >= (int)fVar115) * (int)fVar115;
                    uVar164 = (uint)((int)fVar142 < (int)fVar117) * (int)fVar142 |
                              (uint)((int)fVar142 >= (int)fVar117) * (int)fVar117;
                    uVar168 = (uint)((int)fVar145 < (int)fVar119) * (int)fVar145 |
                              (uint)((int)fVar145 >= (int)fVar119) * (int)fVar119;
                    uVar157 = ((int)uVar156 < (int)uVar173) * uVar173 |
                              ((int)uVar156 >= (int)uVar173) * uVar156;
                    uVar161 = ((int)uVar160 < (int)uVar175) * uVar175 |
                              ((int)uVar160 >= (int)uVar175) * uVar160;
                    uVar165 = ((int)uVar164 < (int)uVar177) * uVar177 |
                              ((int)uVar164 >= (int)uVar177) * uVar164;
                    uVar169 = ((int)uVar168 < (int)uVar179) * uVar179 |
                              ((int)uVar168 >= (int)uVar179) * uVar168;
                    uVar156 = (uint)((int)fVar121 < (int)fVar48) * (int)fVar48 |
                              (uint)((int)fVar121 >= (int)fVar48) * (int)fVar121;
                    uVar160 = (uint)((int)fVar126 < (int)fVar65) * (int)fVar65 |
                              (uint)((int)fVar126 >= (int)fVar65) * (int)fVar126;
                    uVar164 = (uint)((int)fVar129 < (int)fVar67) * (int)fVar67 |
                              (uint)((int)fVar129 >= (int)fVar67) * (int)fVar129;
                    uVar168 = (uint)((int)fVar132 < (int)fVar69) * (int)fVar69 |
                              (uint)((int)fVar132 >= (int)fVar69) * (int)fVar132;
                    uVar173 = (uint)((int)fVar147 < (int)fVar100) * (int)fVar100 |
                              (uint)((int)fVar147 >= (int)fVar100) * (int)fVar147;
                    uVar175 = (uint)((int)fVar153 < (int)fVar104) * (int)fVar104 |
                              (uint)((int)fVar153 >= (int)fVar104) * (int)fVar153;
                    uVar177 = (uint)((int)fVar154 < (int)fVar106) * (int)fVar106 |
                              (uint)((int)fVar154 >= (int)fVar106) * (int)fVar154;
                    uVar179 = (uint)((int)fVar155 < (int)fVar108) * (int)fVar108 |
                              (uint)((int)fVar155 >= (int)fVar108) * (int)fVar155;
                    uVar173 = ((int)uVar156 < (int)uVar173) * uVar156 |
                              ((int)uVar156 >= (int)uVar173) * uVar173;
                    uVar175 = ((int)uVar160 < (int)uVar175) * uVar160 |
                              ((int)uVar160 >= (int)uVar175) * uVar175;
                    uVar177 = ((int)uVar164 < (int)uVar177) * uVar164 |
                              ((int)uVar164 >= (int)uVar177) * uVar177;
                    uVar179 = ((int)uVar168 < (int)uVar179) * uVar168 |
                              ((int)uVar168 >= (int)uVar179) * uVar179;
                    uVar156 = (uint)((int)fVar136 < (int)fVar111) * (int)fVar111 |
                              (uint)((int)fVar136 >= (int)fVar111) * (int)fVar136;
                    uVar160 = (uint)((int)fVar139 < (int)fVar115) * (int)fVar115 |
                              (uint)((int)fVar139 >= (int)fVar115) * (int)fVar139;
                    uVar164 = (uint)((int)fVar142 < (int)fVar117) * (int)fVar117 |
                              (uint)((int)fVar142 >= (int)fVar117) * (int)fVar142;
                    uVar168 = (uint)((int)fVar145 < (int)fVar119) * (int)fVar119 |
                              (uint)((int)fVar145 >= (int)fVar119) * (int)fVar145;
                    uVar156 = ((int)uVar173 < (int)uVar156) * uVar173 |
                              ((int)uVar173 >= (int)uVar156) * uVar156;
                    uVar160 = ((int)uVar175 < (int)uVar160) * uVar175 |
                              ((int)uVar175 >= (int)uVar160) * uVar160;
                    uVar164 = ((int)uVar177 < (int)uVar164) * uVar177 |
                              ((int)uVar177 >= (int)uVar164) * uVar164;
                    uVar168 = ((int)uVar179 < (int)uVar168) * uVar179 |
                              ((int)uVar179 >= (int)uVar168) * uVar168;
                    bVar47 = (float)((tray.tnear.field_0.i[0] < (int)uVar157) * uVar157 |
                                    (uint)(tray.tnear.field_0.i[0] >= (int)uVar157) *
                                    tray.tnear.field_0.i[0]) <=
                             (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar156) *
                                     tray.tfar.field_0.i[0] |
                                    (tray.tfar.field_0.i[0] >= (int)uVar156) * uVar156);
                    bVar7 = (float)((tray.tnear.field_0.i[1] < (int)uVar161) * uVar161 |
                                   (uint)(tray.tnear.field_0.i[1] >= (int)uVar161) *
                                   tray.tnear.field_0.i[1]) <=
                            (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar160) *
                                    tray.tfar.field_0.i[1] |
                                   (tray.tfar.field_0.i[1] >= (int)uVar160) * uVar160);
                    bVar8 = (float)((tray.tnear.field_0.i[2] < (int)uVar165) * uVar165 |
                                   (uint)(tray.tnear.field_0.i[2] >= (int)uVar165) *
                                   tray.tnear.field_0.i[2]) <=
                            (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar164) *
                                    tray.tfar.field_0.i[2] |
                                   (tray.tfar.field_0.i[2] >= (int)uVar164) * uVar164);
                    bVar9 = (float)((tray.tnear.field_0.i[3] < (int)uVar169) * uVar169 |
                                   (uint)(tray.tnear.field_0.i[3] >= (int)uVar169) *
                                   tray.tnear.field_0.i[3]) <=
                            (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar168) *
                                    tray.tfar.field_0.i[3] |
                                   (tray.tfar.field_0.i[3] >= (int)uVar168) * uVar168);
                    if (uVar28 == 6) {
                      fVar69 = *(float *)(uVar29 + 0xe0 + (long)pIVar36 * 4);
                      fVar100 = *(float *)(uVar29 + 0xf0 + (long)pIVar36 * 4);
                      bVar47 = (fVar85 < fVar100 && fVar69 <= fVar85) && bVar47;
                      bVar7 = (fVar94 < fVar100 && fVar69 <= fVar94) && bVar7;
                      bVar8 = (fVar96 < fVar100 && fVar69 <= fVar96) && bVar8;
                      bVar9 = (fVar98 < fVar100 && fVar69 <= fVar98) && bVar9;
                    }
                    auVar55._0_4_ =
                         (-(uint)bVar47 & -(uint)(fVar135 < tray.tfar.field_0.v[0])) << 0x1f;
                    auVar55._4_4_ =
                         (-(uint)bVar7 & -(uint)(fVar138 < tray.tfar.field_0.v[1])) << 0x1f;
                    auVar55._8_4_ =
                         (-(uint)bVar8 & -(uint)(fVar141 < tray.tfar.field_0.v[2])) << 0x1f;
                    auVar55._12_4_ =
                         (-(uint)bVar9 & -(uint)(fVar144 < tray.tfar.field_0.v[3])) << 0x1f;
                    uVar156 = movmskps((int)valid_i,auVar55);
                    valid_i = (vint<4> *)(ulong)uVar156;
                    if ((uVar156 != 0) &&
                       (auVar10._4_4_ = uVar161, auVar10._0_4_ = uVar157, auVar10._8_4_ = uVar165,
                       auVar10._12_4_ = uVar169,
                       aVar87.v = (__m128)blendvps(aVar208.v,auVar10,auVar55), root.ptr = sVar3,
                       sVar45 != 8)) {
                      pNVar46->ptr = sVar45;
                      pNVar46 = pNVar46 + 1;
                      *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar44->v = aVar199;
                      paVar44 = paVar44 + 1;
                    }
                  }
                } while ((sVar3 != 8) &&
                        (valid_i = (vint<4> *)((long)&pIVar36->ptr + 1),
                        bVar47 = pIVar36 < (Intersectors *)0x3, pIVar36 = (Intersectors *)valid_i,
                        sVar45 = root.ptr, aVar199 = aVar87, bVar47));
                iVar27 = 0;
                if (root.ptr == 8) {
LAB_0024bac8:
                  bVar47 = false;
                  iVar27 = 4;
                }
                else {
                  auVar56._4_4_ = -(uint)(aVar87.v[1] < tray.tfar.field_0.v[1]);
                  auVar56._0_4_ = -(uint)(aVar87.v[0] < tray.tfar.field_0.v[0]);
                  auVar56._8_4_ = -(uint)(aVar87.v[2] < tray.tfar.field_0.v[2]);
                  auVar56._12_4_ = -(uint)(aVar87.v[3] < tray.tfar.field_0.v[3]);
                  uVar34 = movmskps(uVar28,auVar56);
                  bVar47 = true;
                  if ((uint)POPCOUNT(uVar34) <= uVar39) {
                    pNVar46->ptr = root.ptr;
                    pNVar46 = pNVar46 + 1;
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar44->v = aVar87;
                    paVar44 = paVar44 + 1;
                    goto LAB_0024bac8;
                  }
                }
              } while (bVar47);
            }
          }
        }
      } while (iVar27 != 3);
      auVar81._0_4_ = uVar172 & terminated.field_0.i[0];
      auVar81._4_4_ = uVar174 & terminated.field_0.i[1];
      auVar81._8_4_ = uVar176 & terminated.field_0.i[2];
      auVar81._12_4_ = uVar178 & terminated.field_0.i[3];
      auVar81 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01feba00,auVar81);
      *(undefined1 (*) [16])(ray + 0x80) = auVar81;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }